

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

QStringList * __thiscall
QInputDialog::comboBoxItems(QStringList *__return_storage_ptr__,QInputDialog *this)

{
  long lVar1;
  QComboBox *this_00;
  int iVar2;
  int index;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  this_00 = *(QComboBox **)(lVar1 + 0x310);
  if (this_00 != (QComboBox *)0x0) {
    iVar2 = QComboBox::count(this_00);
    QList<QString>::reserve(__return_storage_ptr__,(long)iVar2);
    index = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != index; index = index + 1) {
      QComboBox::itemText((QString *)&QStack_48,*(QComboBox **)(lVar1 + 0x310),index);
      QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&QStack_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QInputDialog::comboBoxItems() const
{
    Q_D(const QInputDialog);
    QStringList result;
    if (d->comboBox) {
        const int count = d->comboBox->count();
        result.reserve(count);
        for (int i = 0; i < count; ++i)
            result.append(d->comboBox->itemText(i));
    }
    return result;
}